

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O1

void * __thiscall
density_tests::DeepTestAllocator<256UL>::try_allocate_page
          (DeepTestAllocator<256UL> *this,progress_guarantee i_progress_guarantee)

{
  pointer ppIVar1;
  bool bVar2;
  void *i_block;
  pointer ppIVar3;
  long *in_FS_OFFSET;
  
  bVar2 = ThreadAllocRandomFailures::should_fail();
  if (bVar2) {
    i_block = (void *)0x0;
  }
  else {
    density::detail::PageAllocator<density::detail::SystemPageManager<256ul>>::t_instance::
    __tls_init();
    i_block = density::detail::PageAllocator<density::detail::SystemPageManager<256UL>_>::
              try_allocate_page<(density::detail::page_allocation_type)0>
                        ((PageAllocator<density::detail::SystemPageManager<256UL>_> *)
                         (*in_FS_OFFSET + -0x68),i_progress_guarantee);
    if (i_block != (void *)0x0) {
      SharedBlockRegistry::register_block(&this->m_registry,4,i_block,0xf0,0x100,0);
      ppIVar1 = (this->m_hooks).
                super__Vector_base<density_tests::IAllocatorHook_*,_std::allocator<density_tests::IAllocatorHook_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar3 = (this->m_hooks).
                     super__Vector_base<density_tests::IAllocatorHook_*,_std::allocator<density_tests::IAllocatorHook_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppIVar3 != ppIVar1;
          ppIVar3 = ppIVar3 + 1) {
        (*(code *)**(undefined8 **)*ppIVar3)(*ppIVar3,i_block);
      }
    }
  }
  return i_block;
}

Assistant:

void * try_allocate_page(density::progress_guarantee i_progress_guarantee)
        {
            if (ThreadAllocRandomFailures::should_fail())
                return nullptr;

            auto page = Base::try_allocate_page(i_progress_guarantee);
            if (page != nullptr)
            {
                m_registry.register_block(s_page_category, page, page_size, page_alignment, 0);
                invoke_hook(&IAllocatorHook::on_allocated_page, page);
            }
            return page;
        }